

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CategoricalMapping.pb.h
# Opt level: O2

string * __thiscall
CoreML::Specification::CategoricalMapping::mutable_strvalue_abi_cxx11_(CategoricalMapping *this)

{
  string *psVar1;
  
  if (this->_oneof_case_[1] != 0x65) {
    clear_ValueOnUnknown(this);
    this->_oneof_case_[1] = 0x65;
    (this->ValueOnUnknown_).int64value_ =
         (int64)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  }
  psVar1 = google::protobuf::internal::ArenaStringPtr::MutableNoArena
                     (&(this->ValueOnUnknown_).strvalue_,
                      (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  return psVar1;
}

Assistant:

inline ::std::string* CategoricalMapping::mutable_strvalue() {
  if (!has_strvalue()) {
    clear_ValueOnUnknown();
    set_has_strvalue();
    ValueOnUnknown_.strvalue_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.CategoricalMapping.strValue)
  return ValueOnUnknown_.strvalue_.MutableNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
}